

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

Parser * __thiscall minja::Parser::unexpected(Parser *this,TemplateToken *token)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  long in_RDX;
  ulong uVar4;
  undefined8 uVar5;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70;
  long lStack_68;
  string local_60;
  string local_40;
  
  TemplateToken::typeToString_abi_cxx11_
            (&local_40,(TemplateToken *)(ulong)*(uint *)(in_RDX + 8),(Type)in_RDX);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x2242fb);
  puVar3 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar3) {
    local_70 = *puVar3;
    lStack_68 = plVar1[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *puVar3;
    local_80 = (ulong *)*plVar1;
  }
  local_78 = plVar1[1];
  *plVar1 = (long)puVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  error_location_suffix(&local_60,(string *)token->_vptr_TemplateToken,*(size_t *)(in_RDX + 0x20));
  uVar4 = 0xf;
  if (local_80 != &local_70) {
    uVar4 = local_70;
  }
  if (uVar4 < local_60._M_string_length + local_78) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar5 = local_60.field_2._M_allocated_capacity;
    }
    if (local_60._M_string_length + local_78 <= (ulong)uVar5) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
      goto LAB_001f0f55;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60._M_dataplus._M_p);
LAB_001f0f55:
  local_a0 = &local_90;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_90 = *plVar1;
    uStack_88 = puVar2[3];
  }
  else {
    local_90 = *plVar1;
    local_a0 = (long *)*puVar2;
  }
  local_98 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::runtime_error::runtime_error((runtime_error *)this,(string *)&local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

std::runtime_error unexpected(const TemplateToken & token) const {
      return std::runtime_error("Unexpected " + TemplateToken::typeToString(token.type)
        + error_location_suffix(*template_str, token.location.pos));
    }